

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O3

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::
WriteConObjExpressions
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *this)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  
  iVar1 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons;
  if (iVar1 < 1) {
    uVar4 = 0;
  }
  else {
    uVar2 = 0;
    do {
      uVar4 = uVar2 + 1;
      pcVar3 = (*(this->feeder_->nlf2_c_).ConDescription)
                         ((this->feeder_->nlf2_c_).p_user_data_,uVar2);
      TextFormatter::apr(&this->super_FormatterType,&this->nm,"%c%d\t#%s\n",0x43,(ulong)uVar2,pcVar3
                        );
      TextFormatter::nput(&this->super_FormatterType,&this->nm,0.0);
      iVar1 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons;
      uVar2 = uVar4;
    } while ((int)uVar4 < iVar1);
  }
  if ((int)uVar4 <
      (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_logical_cons + iVar1) {
    do {
      uVar2 = uVar4 + 1;
      pcVar3 = (*(this->feeder_->nlf2_c_).ConDescription)
                         ((this->feeder_->nlf2_c_).p_user_data_,uVar4);
      TextFormatter::apr(&this->super_FormatterType,&this->nm,"%c%d\t#%s\n",0x4c,
                         (ulong)(uVar4 - iVar1),pcVar3);
      TextFormatter::nput(&this->super_FormatterType,&this->nm,0.0);
      iVar1 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons;
      uVar4 = uVar2;
    } while ((int)uVar2 <
             (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_logical_cons + iVar1);
  }
  if (0 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_objs) {
    uVar4 = 0;
    do {
      uVar2 = (*(this->feeder_->nlf2_c_).ObjType)((this->feeder_->nlf2_c_).p_user_data_,uVar4);
      pcVar3 = (*(this->feeder_->nlf2_c_).ObjDescription)
                         ((this->feeder_->nlf2_c_).p_user_data_,uVar4);
      TextFormatter::apr(&this->super_FormatterType,&this->nm,"%c%d %d\t#%s\n",0x4f,(ulong)uVar4,
                         (ulong)uVar2,pcVar3);
      TextFormatter::nput(&this->super_FormatterType,&this->nm,0.0);
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_objs);
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteConObjExpressions() {
  int i=0;
  for (; i<Hdr().num_algebraic_cons; ++i) {
    WriteDefinedVariables(i+1);              // i+1
    apr(nm, "%c%d\t#%s\n", 'C', i,
        Feeder().ConDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedConExpression(i, ew);
  }
  for (;
       i<Hdr().num_algebraic_cons + Hdr().num_logical_cons;
       ++i) {
    WriteDefinedVariables(i+1);              // i+1
    apr(nm, "%c%d\t#%s\n", 'L',
        i - Hdr().num_algebraic_cons,
        Feeder().ConDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedConExpression(i, ew);
  }
  for (i=0; i<Hdr().num_objs; ++i) {
    WriteDefinedVariables(-i-1);              // -i-1
    apr(nm, "%c%d %d\t#%s\n", 'O', i,
        (int)Feeder().ObjType(i),
        Feeder().ObjDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedObjExpression(i, ew);
  }
}